

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void compileoptiongetFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  i64 iVar1;
  char *z;
  
  iVar1 = sqlite3VdbeIntValue(*argv);
  z = "THREADSAFE=1";
  if ((int)iVar1 != 0) {
    z = (char *)0x0;
  }
  setResultStrOrError(context,z,-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

static void compileoptiongetFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  int n;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-04922-24076 The sqlite_compileoption_get() SQL function
  ** is a wrapper around the sqlite3_compileoption_get() C/C++ function.
  */
  n = sqlite3_value_int(argv[0]);
  sqlite3_result_text(context, sqlite3_compileoption_get(n), -1, SQLITE_STATIC);
}